

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

ostream * tcu::operator<<(ostream *str,TextureFormat format)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = *(char **)(&DAT_00b6fbc0 + (long)(int)format.order * 8);
  sVar2 = strlen(pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
  pcVar1 = (&PTR_anon_var_dwarf_198b84f_00b6fc70)[(long)format >> 0x20];
  sVar2 = strlen(pcVar1);
  std::__ostream_insert<char,std::char_traits<char>>(str,pcVar1,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (str,deqp::gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1,0);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, TextureFormat format)
{
	return str << format.order << ", " << format.type << "";
}